

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O1

int x509v3_looks_like_dns_name(uchar *in,size_t len)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (len == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = len - (in[len - 1] == '.');
  }
  if (((1 < uVar6) && (*in == '*')) && (in[1] == '.')) {
    in = in + 2;
    uVar6 = uVar6 - 2;
  }
  if (uVar6 == 0) {
    uVar4 = 0;
  }
  else {
    bVar8 = false;
    uVar5 = 0;
    uVar7 = 0;
    do {
      bVar1 = in[uVar5];
      iVar3 = OPENSSL_isalnum((uint)bVar1);
      bVar2 = true;
      if (iVar3 == 0) {
        if (bVar1 < 0x3a) {
          if (bVar1 == 0x2d) {
            if (uVar5 <= uVar7) goto LAB_001ace94;
          }
          else if (((bVar1 == 0x2e) && (uVar7 < uVar5)) && (uVar5 < uVar6 - 1)) {
            uVar7 = uVar5 + 1;
          }
          else {
LAB_001ace94:
            bVar2 = false;
          }
        }
        else if ((bVar1 != 0x3a) && (bVar1 != 0x5f)) goto LAB_001ace94;
      }
      if (!bVar2) break;
      uVar5 = uVar5 + 1;
      bVar8 = uVar6 <= uVar5;
    } while (uVar5 != uVar6);
    uVar4 = (uint)bVar8;
  }
  return uVar4;
}

Assistant:

int x509v3_looks_like_dns_name(const unsigned char *in, size_t len) {
  // This function is used as a heuristic for whether a common name is a
  // hostname to be matched, or merely a decorative name to describe the
  // subject. This heuristic must be applied to both name constraints and the
  // common name fallback, so it must be loose enough to accept hostname
  // common names, and tight enough to reject decorative common names.

  if (len > 0 && in[len - 1] == '.') {
    len--;
  }

  // Wildcards are allowed in front.
  if (len >= 2 && in[0] == '*' && in[1] == '.') {
    in += 2;
    len -= 2;
  }

  if (len == 0) {
    return 0;
  }

  size_t label_start = 0;
  for (size_t i = 0; i < len; i++) {
    unsigned char c = in[i];
    if (OPENSSL_isalnum(c) || (c == '-' && i > label_start) ||
        // These are not valid characters in hostnames, but commonly found
        // in deployments outside the Web PKI.
        c == '_' || c == ':') {
      continue;
    }

    // Labels must not be empty.
    if (c == '.' && i > label_start && i < len - 1) {
      label_start = i + 1;
      continue;
    }

    return 0;
  }

  return 1;
}